

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

Cord __thiscall
google::protobuf::io::(anonymous_namespace)::
MakeFragmentedCord<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
          (_anonymous_namespace_ *this,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *c)

{
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  pointer __dest;
  const_pointer __src;
  undefined8 extraout_RDX;
  Span<char> SVar4;
  Cord CVar5;
  CordBuffer local_98;
  undefined1 local_88 [8];
  Span<char> out;
  undefined1 local_68 [8];
  CordBuffer buffer;
  string_view sv;
  basic_string_view<char,_std::char_traits<char>_> *s;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *c_local;
  Cord *result;
  
  absl::lts_20250127::Cord::Cord((Cord *)this);
  __end0 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::begin(c);
  s = (basic_string_view<char,_std::char_traits<char>_> *)
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::end(c);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                     *)&s), bVar1) {
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             ::operator*(&__end0);
    buffer.rep_.field_0.long_rep.padding = (void *)pbVar2->_M_len;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&buffer.rep_.field_0 + 8));
    absl::lts_20250127::CordBuffer::CreateWithDefaultLimit((CordBuffer *)local_68,sVar3);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&buffer.rep_.field_0 + 8));
    SVar4 = absl::lts_20250127::CordBuffer::available_up_to((CordBuffer *)local_68,sVar3);
    out.ptr_ = (pointer)SVar4.len_;
    local_88 = (undefined1  [8])SVar4.ptr_;
    __dest = absl::lts_20250127::Span<char>::data((Span<char> *)local_88);
    __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&buffer.rep_.field_0 + 8));
    sVar3 = absl::lts_20250127::Span<char>::size((Span<char> *)local_88);
    memcpy(__dest,__src,sVar3);
    sVar3 = absl::lts_20250127::Span<char>::size((Span<char> *)local_88);
    absl::lts_20250127::CordBuffer::SetLength((CordBuffer *)local_68,sVar3);
    absl::lts_20250127::CordBuffer::CordBuffer(&local_98,(CordBuffer *)local_68);
    absl::lts_20250127::Cord::Append((Cord *)this,&local_98);
    absl::lts_20250127::CordBuffer::~CordBuffer(&local_98);
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)local_68);
    __gnu_cxx::
    __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::operator++(&__end0);
  }
  CVar5.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)extraout_RDX;
  CVar5.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar5.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord MakeFragmentedCord(const Container& c) {
  absl::Cord result;
  for (const auto& s : c) {
    absl::string_view sv(s);
    auto buffer = absl::CordBuffer::CreateWithDefaultLimit(sv.size());
    absl::Span<char> out = buffer.available_up_to(sv.size());
    memcpy(out.data(), sv.data(), out.size());
    buffer.SetLength(out.size());
    result.Append(std::move(buffer));
  }
  return result;
}